

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RenderDesc.cpp
# Opt level: O3

Expected<renderdesc::Command::Flag,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
* __thiscall
renderdesc::flagFromValue_abi_cxx11_
          (Expected<renderdesc::Command::Flag,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *__return_storage_ptr__,renderdesc *this,Value *v)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  undefined8 uVar2;
  reference_wrapper<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  rVar3;
  Expected<renderdesc::Command::Flag,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *extraout_RAX;
  ExpectedRef<const_std::string,_std::string> s_result;
  undefined1 local_78 [16];
  undefined1 local_68 [40];
  size_type sStack_40;
  undefined1 local_38 [32];
  bool local_18;
  
  yaml::Value::getString_abi_cxx11_
            ((ExpectedRef<const_std::string,_std::string> *)local_38,(Value *)this);
  uVar2 = local_38._0_8_;
  if (local_18 == false) {
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_78,
                   "Cannot read Flag: ",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_38);
LAB_0012914c:
    rVar3._M_data =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(local_68 + 0x20);
    if ((Expected<renderdesc::Command::Flag,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)local_78._0_8_ ==
        (Expected<renderdesc::Command::Flag,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)local_68) {
      sStack_40 = local_68._8_8_;
      local_78._0_8_ = rVar3._M_data;
    }
    else {
      local_68._16_8_ = local_78._0_8_;
    }
    paVar1 = &(__return_storage_ptr__->field_0).error_.error_.field_2;
    *(anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
      **)&__return_storage_ptr__->field_0 = paVar1;
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_78._0_8_ ==
        rVar3._M_data) {
      paVar1->_M_allocated_capacity = local_68._0_8_;
      *(size_type *)((long)&(__return_storage_ptr__->field_0).error_.error_.field_2 + 8) = sStack_40
      ;
    }
    else {
      (__return_storage_ptr__->field_0).error_.error_._M_dataplus._M_p = (pointer)local_78._0_8_;
      (__return_storage_ptr__->field_0).error_.error_.field_2._M_allocated_capacity = local_68._0_8_
      ;
      rVar3._M_data =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_68._0_8_;
    }
    (__return_storage_ptr__->field_0).error_.error_._M_string_length = local_78._8_8_;
    __return_storage_ptr__->has_value_ = false;
  }
  else {
    rVar3._M_data =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
         std::__cxx11::string::compare((char *)local_38._0_8_);
    if ((int)rVar3._M_data == 0) {
      (__return_storage_ptr__->field_0).value_ = DepthTest;
    }
    else {
      rVar3._M_data =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           std::__cxx11::string::compare((char *)uVar2);
      if ((int)rVar3._M_data != 0) {
        format_abi_cxx11_((string *)local_78,"Unknown flag %s",*(undefined8 *)uVar2);
        goto LAB_0012914c;
      }
      (__return_storage_ptr__->field_0).value_ = VertexProgramPointSize;
    }
    __return_storage_ptr__->has_value_ = true;
  }
  if (local_18 == false) {
    rVar3._M_data =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(local_38 + 0x10);
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_38._0_8_ !=
        rVar3._M_data) {
      operator_delete((void *)local_38._0_8_,local_38._16_8_ + 1);
      rVar3._M_data =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)extraout_RAX;
    }
  }
  return (Expected<renderdesc::Command::Flag,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          *)rVar3._M_data;
}

Assistant:

static Expected<Command::Flag, std::string> flagFromValue(const yaml::Value &v) {
	auto s_result = v.getString();
	if (!s_result)
		return Unexpected("Cannot read Flag: " + s_result.error());

	const std::string &s = s_result.value();
	if (s == "DepthTest") return Command::Flag::DepthTest;
#ifndef ATTO_PLATFORM_RPI
	if (s == "VertexProgramPointSize") return Command::Flag::VertexProgramPointSize;
#endif

	return Unexpected(format("Unknown flag %s", s.c_str()));
}